

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O0

int WebPPlaneDistortion(uint8_t *src,size_t src_stride,uint8_t *ref,size_t ref_stride,int width,
                       int height,size_t x_step,int type,float *distortion,float *result)

{
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar1;
  long in_stack_00000008;
  uint8_t *tmp2;
  uint8_t *tmp1;
  int y;
  int x;
  AccumulateFunc metric;
  uint8_t *allocated;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  code *pcVar2;
  code *v;
  void *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  void *local_20;
  void *local_10;
  int local_4;
  
  if ((int)tmp2 == 0) {
    pcVar2 = AccumulateSSE;
  }
  else {
    pcVar2 = AccumulateLSIM;
    if ((int)tmp2 == 1) {
      pcVar2 = AccumulateSSIM;
    }
  }
  if ((((in_RDI == (void *)0x0) || (in_RDX == (void *)0x0)) ||
      (in_RSI < (ulong)(in_stack_00000008 * in_R8D))) ||
     (((in_RCX < (ulong)(in_stack_00000008 * in_R8D) || (_y == (float *)0x0)) ||
      (tmp1 == (uint8_t *)0x0)))) {
    local_4 = 0;
  }
  else {
    v = pcVar2;
    VP8SSIMDspInit();
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_stack_00000008 != 1) {
      in_stack_ffffffffffffffb0 = WebPSafeMalloc((uint64_t)in_stack_ffffffffffffffa8,(size_t)v);
      if (in_stack_ffffffffffffffb0 == (void *)0x0) {
        return 0;
      }
      in_stack_ffffffffffffffa8 =
           (void *)((long)in_stack_ffffffffffffffb0 + (long)in_R8D * (long)in_R9D);
      for (local_48 = 0; local_20 = in_stack_ffffffffffffffa8, local_10 = in_stack_ffffffffffffffb0,
          local_48 < in_R9D; local_48 = local_48 + 1) {
        for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
          *(undefined1 *)((long)in_stack_ffffffffffffffb0 + (long)(local_44 + local_48 * in_R8D)) =
               *(undefined1 *)
                ((long)in_RDI + local_44 * in_stack_00000008 + (long)local_48 * in_RSI);
          *(undefined1 *)((long)in_stack_ffffffffffffffa8 + (long)(local_44 + local_48 * in_R8D)) =
               *(undefined1 *)
                ((long)in_RDX + local_44 * in_stack_00000008 + (long)local_48 * in_RCX);
        }
      }
    }
    dVar1 = (double)(*pcVar2)(local_10,in_R8D,local_20,in_R8D,in_R8D,in_R9D);
    *(float *)tmp1 = (float)dVar1;
    WebPSafeFree((void *)0x159674);
    if ((int)tmp2 == 1) {
      dVar1 = GetLogSSIM((double)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    }
    else {
      dVar1 = GetPSNR((double)v,
                      (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    *_y = (float)dVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPPlaneDistortion(const uint8_t* src, size_t src_stride,
                        const uint8_t* ref, size_t ref_stride,
                        int width, int height, size_t x_step,
                        int type, float* distortion, float* result) {
  uint8_t* allocated = NULL;
  const AccumulateFunc metric = (type == 0) ? AccumulateSSE :
                                (type == 1) ? AccumulateSSIM :
                                              AccumulateLSIM;
  if (src == NULL || ref == NULL ||
      src_stride < x_step * width || ref_stride < x_step * width ||
      result == NULL || distortion == NULL) {
    return 0;
  }

  VP8SSIMDspInit();
  if (x_step != 1) {   // extract a packed plane if needed
    int x, y;
    uint8_t* tmp1;
    uint8_t* tmp2;
    allocated =
        (uint8_t*)WebPSafeMalloc(2ULL * width * height, sizeof(*allocated));
    if (allocated == NULL) return 0;
    tmp1 = allocated;
    tmp2 = tmp1 + (size_t)width * height;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        tmp1[x + y * width] = src[x * x_step + y * src_stride];
        tmp2[x + y * width] = ref[x * x_step + y * ref_stride];
      }
    }
    src = tmp1;
    ref = tmp2;
  }
  *distortion = (float)metric(src, width, ref, width, width, height);
  WebPSafeFree(allocated);

  *result = (type == 1) ? (float)GetLogSSIM(*distortion, (double)width * height)
                        : (float)GetPSNR(*distortion, (double)width * height);
  return 1;
}